

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O2

bool __thiscall
senjo::PerftCommandHandle::Process
          (PerftCommandHandle *this,char *params,uint64_t *count,uint64_t *nodes,uint64_t *qnodes)

{
  ChessEngine *pCVar1;
  int depth;
  char *pcVar2;
  uint64_t uVar3;
  ulong uVar4;
  byte bVar5;
  uint64_t node_count;
  Output local_58;
  uint64_t *local_50;
  uint64_t *local_48;
  char *local_40;
  uint64_t qnode_count;
  
  depth = 0;
  for (local_40 = params + 1; (int)*local_40 - 0x30U < 10; local_40 = local_40 + 1) {
    depth = ((int)*local_40 - 0x30U) + depth * 10;
  }
  bVar5 = 1;
  if ((depth != 0) && ((this->maxDepth == 0 || (depth <= this->maxDepth)))) {
    local_50 = nodes;
    local_48 = qnodes;
    NextWord(&local_40);
    uVar4 = 0;
    for (pcVar2 = local_40; (int)*pcVar2 - 0x30U < 10; pcVar2 = pcVar2 + 1) {
      uVar4 = (uVar4 * 10 + (long)(int)*pcVar2) - 0x30;
    }
    if ((uVar4 != 0) && ((this->maxLeafs == 0 || (uVar4 <= this->maxLeafs)))) {
      Output::Output((Output *)&node_count,InfoPrefix);
      std::operator<<((ostream *)&std::cout,"--- ");
      std::ostream::operator<<((ostream *)&std::cout,depth);
      std::operator<<((ostream *)&std::cout," => ");
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      Output::~Output((Output *)&node_count);
      pCVar1 = (this->super_BackgroundCommand).engine;
      if (this->qperft == true) {
        uVar3 = ChessEngine::QPerft(pCVar1,depth);
      }
      else {
        uVar3 = ChessEngine::Perft(pCVar1,depth);
      }
      node_count = 0;
      qnode_count = 0;
      pCVar1 = (this->super_BackgroundCommand).engine;
      (*pCVar1->_vptr_ChessEngine[0x10])(pCVar1,0,0,&node_count,&qnode_count,0,0,0,0);
      *count = *count + uVar3;
      *local_50 = *local_50 + node_count;
      *local_48 = *local_48 + qnode_count;
      bVar5 = uVar3 == uVar4 | this->qperft;
      if (bVar5 == 0) {
        Output::Output(&local_58,InfoPrefix);
        std::operator<<((ostream *)&std::cout,"--- ");
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<((ostream *)&std::cout," != ");
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        Output::~Output(&local_58);
      }
    }
  }
  return (bool)bVar5;
}

Assistant:

bool PerftCommandHandle::Process(const char* params, uint64_t& count,
                                 uint64_t& nodes, uint64_t& qnodes)
{
  const char* p = (params + 1);
  int depth = 0;
  while (*p && isdigit(*p)) {
    depth = ((10 * depth) + (*p++ - '0'));
    if (depth < 0) {
      Output() << "invalid depth: " << params;
      return true;
    }
  }
  if (!depth || (maxDepth && (depth > maxDepth))) {
    return true;
  }

  NextWord(p);

  uint64_t expected = 0;
  while (*p && isdigit(*p)) {
    expected = ((10 * expected) + (*p++ - '0'));
  }
  if (!expected || (maxLeafs && (expected > maxLeafs))) {
    return true;
  }

  Output() << "--- " << depth << " => " << expected;
  uint64_t perft_count = qperft ? engine->QPerft(depth) : engine->Perft(depth);
  uint64_t node_count = 0;
  uint64_t qnode_count = 0;

  engine->GetStats(NULL, NULL, &node_count, &qnode_count);
  count += perft_count;
  nodes += node_count;
  qnodes += qnode_count;

  if (!qperft && (perft_count != expected)) {
    Output() << "--- " << perft_count << " != " << expected;
    return false;
  }

  return true;
}